

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxAnalysis.h
# Opt level: O2

shared_ptr<const_calc4::Operator> __thiscall
calc4::LoadVariableToken::CreateOperator
          (LoadVariableToken *this,
          vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          *operands,CompilationContext *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_calc4::Operator> sVar2;
  _Alloc_hider local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  LoadVariableOperator::Create((string *)&stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Token)._vptr_Token = (_func_int **)local_18._M_p;
  (this->super_Token).position.index = (size_t)_Var1._M_pi;
  local_18._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_calc4::Operator>)
         sVar2.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const Operator> CreateOperator(
        const std::vector<std::shared_ptr<const Operator>>& operands,
        CompilationContext& context) const override
    {
        return LoadVariableOperator::Create(supplementaryText);
    }